

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::PrepareVisitor::PrepareVisitor(PrepareVisitor *this)

{
  undefined8 *in_RDI;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x129888);
  *in_RDI = &PTR__PrepareVisitor_004863d0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"prepareVisitor");
  return;
}

Assistant:

PrepareVisitor() : BaseVisitor() { visitorName = "prepareVisitor"; }